

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::from_integer<int,jsoncons::stream_sink<char>>(int value,stream_sink<char> *result)

{
  ulong uVar1;
  assertion_error *this;
  uint uVar2;
  int iVar3;
  type_conflict2 tVar4;
  type_conflict2 tVar5;
  ulong uVar6;
  char *pcVar7;
  allocator<char> local_149;
  string local_148;
  char_type buf [255];
  
  uVar1 = (ulong)(uint)value;
  uVar6 = 0;
  if (value < 0) {
    do {
      iVar3 = (int)uVar1;
      uVar1 = (long)iVar3 / 10 & 0xffffffff;
      buf[uVar6] = '0' - (char)(iVar3 % 10);
      tVar5 = uVar6 + 1;
      if (0xfd < uVar6) break;
      uVar6 = tVar5;
    } while (iVar3 - 10U < 0xffffffed);
  }
  else {
    do {
      uVar2 = (uint)uVar1;
      buf[uVar6] = (byte)(uVar1 % 10) | 0x30;
      tVar5 = uVar6 + 1;
      if (0xfd < uVar6) break;
      uVar1 = uVar1 / 10;
      uVar6 = tVar5;
    } while (9 < uVar2);
  }
  if (tVar5 == 0xff) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"assertion \'p != last\' failed at  <> :0",&local_149);
    assertion_error::assertion_error(this,&local_148);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar4 = tVar5;
  if (value < 0) {
    stream_sink<char>::push_back(result,'-');
    tVar4 = tVar5 + 1;
  }
  pcVar7 = buf + tVar5;
  while (pcVar7 = pcVar7 + -1, buf <= pcVar7) {
    stream_sink<char>::push_back(result,*pcVar7);
  }
  return tVar4;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }